

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::TaskSet::add(TaskSet *this,Promise<void> *promise)

{
  Promise<void> *promise_00;
  Task *pTVar1;
  Task *pTVar2;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *other;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *t;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> local_50;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *local_48;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *head;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *local_30;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *_head368;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> local_20;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> task;
  Promise<void> *promise_local;
  TaskSet *this_local;
  
  task.ptr = (Task *)promise;
  promise_00 = mv<kj::Promise<void>>(promise);
  kj::_::PromiseNode::from<kj::Promise<void>>((PromiseNode *)&_head368,promise_00);
  kj::_::PromiseDisposer::appendPromise<kj::TaskSet::Task,kj::_::PromiseDisposer,kj::TaskSet&>
            ((PromiseDisposer *)&local_20,(OwnPromiseNode *)&_head368,this);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_head368);
  local_30 = kj::_::readMaybe<kj::TaskSet::Task,kj::_::PromiseDisposer>(&this->tasks);
  if (local_30 != (Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *)0x0) {
    local_48 = local_30;
    pTVar1 = Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::operator->(&local_20);
    pTVar2 = Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::operator->(local_48);
    pTVar2->prev = &pTVar1->next;
    other = mv<kj::Maybe<kj::Own<kj::TaskSet::Task,kj::_::PromiseDisposer>>>(&this->tasks);
    pTVar1 = Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::operator->(&local_20);
    Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_>::operator=(&pTVar1->next,other);
  }
  pTVar1 = Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::operator->(&local_20);
  pTVar1->prev = &this->tasks;
  t = mv<kj::Own<kj::TaskSet::Task,kj::_::PromiseDisposer>>(&local_20);
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_>::Maybe(&local_50,t);
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_>::operator=(&this->tasks,&local_50);
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_>::~Maybe(&local_50);
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::~Own(&local_20);
  return;
}

Assistant:

void TaskSet::add(Promise<void>&& promise) {
  auto task = _::PromiseDisposer::appendPromise<Task>(_::PromiseNode::from(kj::mv(promise)), *this);
  KJ_IF_SOME(head, tasks) {
    head->prev = &task->next;
    task->next = kj::mv(tasks);
  }
  task->prev = &tasks;
  tasks = kj::mv(task);
}